

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

void gimage::anon_unknown_8::writeRAWHeader(char *name,int type,long width,long height)

{
  char *name_00;
  allocator local_d6;
  allocator local_d5;
  int type_local;
  long height_local;
  string s;
  Properties prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long width_local;
  
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &prop.data._M_t._M_impl.super__Rb_tree_header._M_header;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  type_local = type;
  height_local = height;
  prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       prop.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  width_local = width;
  gutil::Properties::putValue<long>(&prop,"image.width",&width_local);
  gutil::Properties::putValue<long>(&prop,"image.height",&height_local);
  gutil::Properties::putValue<int>(&prop,"image.pixelsize",&type_local);
  s._M_dataplus._M_p._0_1_ = 0;
  gutil::Properties::putValue<bool>(&prop,"image.msbfirst",(bool *)&s);
  std::__cxx11::string::string((string *)&s,name,(allocator *)&local_78);
  std::__cxx11::string::replace((ulong)&s,s._M_string_length - 4,(char *)0x4);
  name_00 = (char *)CONCAT71(s._M_dataplus._M_p._1_7_,s._M_dataplus._M_p._0_1_);
  std::__cxx11::string::string((string *)&local_38,"Header information of RAW File: ",&local_d5);
  std::__cxx11::string::string((string *)&local_58,name,&local_d6);
  std::operator+(&local_78,&local_38,&local_58);
  gutil::Properties::save(&prop,name_00,local_78._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&s);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&prop);
  return;
}

Assistant:

void writeRAWHeader(const char *name, int type, long width, long height)
{
  gutil::Properties prop;

  prop.putValue("image.width", width);
  prop.putValue("image.height", height);
  prop.putValue("image.pixelsize", type);
  prop.putValue("image.msbfirst", false);

  std::string s=name;
  s.replace(s.length()-4, 4, ".hdr");

  prop.save(s.c_str(), (std::string("Header information of RAW File: ")+std::string(name)).c_str());
}